

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test>
::CreateTest(TestFactoryImpl<ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x2a0000002a;
  *(undefined2 *)&this_00[1].gtest_flag_saver_ = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__ContractTestOnClassWithOutInvariant_00150048;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }